

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::BiasParameter::MergePartialFromCodedStream(BiasParameter *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  FillerParameter *this_00;
  ulong extraout_RAX;
  int iVar7;
  UnknownFieldSet *unknown_fields;
  char cVar8;
  uint tag;
  ulong uVar9;
  int local_3c;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0041c028;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0041c028:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    tag = (uint)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_0041c049:
      iVar7 = 7;
      if ((tag & 7) != 4 && tag != 0) {
        pvVar3 = (this->_internal_metadata_).
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 .ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          unknown_fields =
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
        }
        else {
          unknown_fields = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
        if (bVar4) goto LAB_0041c085;
        iVar7 = 6;
      }
    }
    else {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar6 == 3) {
        if (cVar8 != '\x1a') goto LAB_0041c049;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        if (this->filler_ == (FillerParameter *)0x0) {
          this_00 = (FillerParameter *)operator_new(0x40);
          FillerParameter::FillerParameter(this_00);
          this->filler_ = this_00;
        }
        MergePartialFromCodedStream();
        iVar7 = local_3c;
        if ((extraout_RAX & 1) == 0) goto LAB_0041c085;
        goto LAB_0041c087;
      }
      if (uVar6 == 2) {
        if (cVar8 != '\x10') goto LAB_0041c049;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar9 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0041c179;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_0041c179:
          uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar9;
        }
        iVar7 = 6;
        if (bVar4) {
          this->num_axes_ = (int32)uVar9;
          goto LAB_0041c085;
        }
        goto LAB_0041c087;
      }
      if ((uVar6 != 1) || (cVar8 != '\b')) goto LAB_0041c049;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar9 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0041c1a1;
        input->buffer_ = pbVar2 + 1;
        bVar4 = true;
      }
      else {
        uVar5 = 0;
LAB_0041c1a1:
        uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar4 = -1 < (long)uVar9;
      }
      iVar7 = 6;
      if (bVar4) {
        this->axis_ = (int32)uVar9;
LAB_0041c085:
        iVar7 = 0;
      }
    }
LAB_0041c087:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool BiasParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.BiasParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional int32 axis = 1 [default = 1];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 num_axes = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_num_axes();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &num_axes_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FillerParameter filler = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_filler()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.BiasParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.BiasParameter)
  return false;
#undef DO_
}